

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O2

void ws::log_helper<char_const(&)[7],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
               (Severity severity,FormatWithLoc *fmt,char (*args) [7],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               char (*args_2) [13],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  time_point time_point_;
  Record rec;
  string local_90;
  undefined1 local_70 [64];
  
  get_logger_instance();
  if (get_logger_instance::instance.mode != none) {
    time_point_.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    Record::Record((Record *)local_70,time_point_,severity,(fmt->loc)._M_impl);
    std::__cxx11::string::string((string *)&local_90,&fmt->fmt);
    std::__cxx11::string::~string((string *)&local_90);
    if (local_90._M_string_length == 0) {
      Record::
      add_helper<char_const(&)[7],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
                ((Record *)local_70,args,args_1,args_2,args_3);
    }
    else {
      std::__cxx11::string::string((string *)&local_90,&fmt->fmt);
      Record::
      add_fmt<char_const(&)[7],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
                ((Record *)local_70,&local_90,args,args_1,args_2,args_3);
      std::__cxx11::string::~string((string *)&local_90);
    }
    get_logger_instance();
    Logger::add(&get_logger_instance::instance,(Record *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
  }
  return;
}

Assistant:

void log_helper(Severity severity, const FormatWithLoc &fmt, Args &&...args)
  {
    if (get_logger_instance().get_mode() == Output::none)
    {
      return;
    }
    Record rec(std::chrono::system_clock::now(), severity, fmt.get_loc());
    if (fmt.get_fmt().empty())
    {
      rec.add(std::forward<Args>(args)...);
    }
    else
    {
      rec.add_fmt(fmt.get_fmt(), std::forward<Args>(args)...);
    }
    get_logger_instance().add(rec);
  }